

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O2

DecodeStatus
DecodeAFGR64RegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus DVar1;
  uint Reg;
  
  DVar1 = MCDisassembler_Fail;
  if ((RegNo & 1) == 0 && RegNo < 0x1f) {
    Reg = getReg((MCRegisterInfo *)Address,0x24,RegNo >> 1);
    MCOperand_CreateReg0(Inst,Reg);
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeAFGR64RegisterClass(MCInst *Inst,
		unsigned RegNo, uint64_t Address, const MCRegisterInfo *Decoder)
{
	unsigned Reg;

	if (RegNo > 30 || RegNo % 2)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, Mips_AFGR64RegClassID, RegNo /2);
	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}